

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::char_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
           *this,align_spec *spec,char_writer *f)

{
  undefined1 uVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char __tmp;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar3 = (ulong)spec->width_;
  if (uVar3 < 2) {
    lVar8 = *(long *)this;
    p_Var2 = (_List_node_base *)operator_new(0x18);
    *(char_type *)&p_Var2[1]._M_next = f->value;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
  }
  else {
    uVar1 = (undefined1)spec->fill_;
    uVar6 = uVar3 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar4 = uVar6 >> 1;
      lVar8 = *(long *)this;
      uVar7 = uVar4;
      if (spec->width_ != 2) {
        do {
          p_Var2 = (_List_node_base *)operator_new(0x18);
          *(undefined1 *)&p_Var2[1]._M_next = uVar1;
          std::__detail::_List_node_base::_M_hook(p_Var2);
          *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      *(long *)this = lVar8;
      p_Var2 = (_List_node_base *)operator_new(0x18);
      *(char_type *)&p_Var2[1]._M_next = f->value;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
      lVar8 = *(long *)this;
      if (uVar6 != uVar4) {
        lVar5 = (uVar4 - uVar3) + 1;
        do {
          p_Var2 = (_List_node_base *)operator_new(0x18);
          *(undefined1 *)&p_Var2[1]._M_next = uVar1;
          std::__detail::_List_node_base::_M_hook(p_Var2);
          *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
      }
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        lVar8 = *(long *)this;
        do {
          p_Var2 = (_List_node_base *)operator_new(0x18);
          *(undefined1 *)&p_Var2[1]._M_next = uVar1;
          std::__detail::_List_node_base::_M_hook(p_Var2);
          *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        *(long *)this = lVar8;
        p_Var2 = (_List_node_base *)operator_new(0x18);
        *(char_type *)&p_Var2[1]._M_next = f->value;
        std::__detail::_List_node_base::_M_hook(p_Var2);
        *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
        return;
      }
      lVar8 = *(long *)this;
      p_Var2 = (_List_node_base *)operator_new(0x18);
      *(char_type *)&p_Var2[1]._M_next = f->value;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
      lVar8 = *(long *)this;
      do {
        p_Var2 = (_List_node_base *)operator_new(0x18);
        *(undefined1 *)&p_Var2[1]._M_next = uVar1;
        std::__detail::_List_node_base::_M_hook(p_Var2);
        *(long *)(lVar8 + 0x10) = *(long *)(lVar8 + 0x10) + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    *(long *)this = lVar8;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }